

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleSetCPUThreadCount(int instance,int threadCount)

{
  int iVar1;
  BeagleImpl *pBVar2;
  undefined8 extraout_RDX;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x20))
                      (pBVar2,threadCount,extraout_RDX,*(code **)(*(long *)pBVar2 + 0x20));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleSetCPUThreadCount(int instance,
                            int threadCount) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->setCPUThreadCount(threadCount);
    DEBUG_END_TIME();
    return returnValue;
}